

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract2.c
# Opt level: O0

int archive_read_extract2(archive *_a,archive_entry *entry,archive *ad)

{
  wchar_t wVar1;
  la_int64_t lVar2;
  int local_30;
  int local_2c;
  int r2;
  int r;
  archive_read *a;
  archive *ad_local;
  archive_entry *entry_local;
  archive *_a_local;
  
  if (*(int *)&_a[1].vtable != 0) {
    archive_write_disk_set_skip_file
              (ad,*(la_int64_t *)&_a[1].archive_format,(la_int64_t)_a[1].archive_format_name);
  }
  local_2c = archive_write_header(ad,entry);
  if (local_2c < -0x14) {
    local_2c = -0x14;
  }
  if (local_2c == 0) {
    wVar1 = archive_entry_size_is_set(entry);
    if ((wVar1 == L'\0') || (lVar2 = archive_entry_size(entry), 0 < lVar2)) {
      local_2c = copy_data(_a,ad);
    }
  }
  else {
    archive_copy_error(_a,ad);
  }
  local_30 = archive_write_finish_entry(ad);
  if (local_30 < -0x14) {
    local_30 = -0x14;
  }
  if ((local_30 != 0) && (local_2c == 0)) {
    archive_copy_error(_a,ad);
  }
  if (local_30 < local_2c) {
    local_2c = local_30;
  }
  return local_2c;
}

Assistant:

int
archive_read_extract2(struct archive *_a, struct archive_entry *entry,
    struct archive *ad)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r, r2;

	/* Set up for this particular entry. */
	if (a->skip_file_set)
		archive_write_disk_set_skip_file(ad,
		    a->skip_file_dev, a->skip_file_ino);
	r = archive_write_header(ad, entry);
	if (r < ARCHIVE_WARN)
		r = ARCHIVE_WARN;
	if (r != ARCHIVE_OK)
		/* If _write_header failed, copy the error. */
 		archive_copy_error(&a->archive, ad);
	else if (!archive_entry_size_is_set(entry) || archive_entry_size(entry) > 0)
		/* Otherwise, pour data into the entry. */
		r = copy_data(_a, ad);
	r2 = archive_write_finish_entry(ad);
	if (r2 < ARCHIVE_WARN)
		r2 = ARCHIVE_WARN;
	/* Use the first message. */
	if (r2 != ARCHIVE_OK && r == ARCHIVE_OK)
		archive_copy_error(&a->archive, ad);
	/* Use the worst error return. */
	if (r2 < r)
		r = r2;
	return (r);
}